

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O2

idx_t duckdb::ListSearchOp<false>
                (Vector *list_v,Vector *source_v,Vector *target_v,Vector *result_v,
                idx_t target_count)

{
  PhysicalType PVar1;
  idx_t iVar2;
  NotImplementedException *this;
  PhysicalType type;
  allocator local_59;
  string local_58;
  string local_38;
  
  PVar1 = (target_v->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    iVar2 = ListSearchSimpleOp<signed_char,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case UINT8:
    iVar2 = ListSearchSimpleOp<unsigned_char,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case UINT16:
    iVar2 = ListSearchSimpleOp<unsigned_short,false>(list_v,source_v,target_v,result_v,target_count)
    ;
    return iVar2;
  case INT16:
    iVar2 = ListSearchSimpleOp<short,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case UINT32:
    iVar2 = ListSearchSimpleOp<unsigned_int,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case INT32:
    iVar2 = ListSearchSimpleOp<int,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case UINT64:
    iVar2 = ListSearchSimpleOp<unsigned_long,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case INT64:
    iVar2 = ListSearchSimpleOp<long,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
    goto switchD_01493f36_caseD_a;
  case FLOAT:
    iVar2 = ListSearchSimpleOp<float,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case DOUBLE:
    iVar2 = ListSearchSimpleOp<double,false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case INTERVAL:
    iVar2 = ListSearchSimpleOp<duckdb::interval_t,false>
                      (list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  case LIST:
  case STRUCT:
  case ARRAY:
    iVar2 = ListSearchNestedOp<false>(list_v,source_v,target_v,result_v,target_count);
    return iVar2;
  default:
    if (PVar1 == VARCHAR) {
      iVar2 = ListSearchSimpleOp<duckdb::string_t,false>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
    if (PVar1 == UINT128) {
      iVar2 = ListSearchSimpleOp<duckdb::uhugeint_t,false>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
    if (PVar1 == INT128) {
      iVar2 = ListSearchSimpleOp<duckdb::hugeint_t,false>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
switchD_01493f36_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"This function has not been implemented for logical type %s",
               &local_59);
    TypeIdToString_abi_cxx11_(&local_58,(duckdb *)(ulong)PVar1,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this,&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

idx_t ListSearchOp(Vector &list_v, Vector &source_v, Vector &target_v, Vector &result_v, idx_t target_count) {
	const auto type = target_v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return ListSearchSimpleOp<int8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT16:
		return ListSearchSimpleOp<int16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT32:
		return ListSearchSimpleOp<int32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT64:
		return ListSearchSimpleOp<int64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT128:
		return ListSearchSimpleOp<hugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT8:
		return ListSearchSimpleOp<uint8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT16:
		return ListSearchSimpleOp<uint16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT32:
		return ListSearchSimpleOp<uint32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT64:
		return ListSearchSimpleOp<uint64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT128:
		return ListSearchSimpleOp<uhugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::FLOAT:
		return ListSearchSimpleOp<float, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::DOUBLE:
		return ListSearchSimpleOp<double, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::VARCHAR:
		return ListSearchSimpleOp<string_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INTERVAL:
		return ListSearchSimpleOp<interval_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return ListSearchNestedOp<RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	default:
		throw NotImplementedException("This function has not been implemented for logical type %s",
		                              TypeIdToString(type));
	}
}